

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_reader.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  KernelExecutionType KVar2;
  KernelPerformanceInfo *pKVar3;
  ulong uVar4;
  string *kernelName;
  reference ppKVar5;
  uint64_t uVar6;
  iterator __first;
  iterator __last;
  size_type sVar7;
  undefined8 uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char *local_3d0;
  char *local_3c0;
  char *local_3b0;
  char *local_328;
  char *local_318;
  char *local_308;
  char *local_268;
  char *local_258;
  char *local_248;
  char *local_1c0;
  char *local_1b0;
  char *local_1a0;
  double callCountDouble_1;
  uint i_3;
  double callCountDouble;
  uint i_2;
  uint i_1;
  allocator<char> local_a9;
  int kernelIndex;
  KernelPerformanceInfo *local_88;
  KernelPerformanceInfo *new_kernel;
  double fileExecuteTime;
  FILE *local_68;
  FILE *the_file;
  long lStack_58;
  int i;
  uint64_t totalKernelsCalls;
  double totalExecuteTime;
  double totalKernelsTime;
  vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
  kernelInfo;
  int local_20;
  int commandline_args;
  int fixed_width;
  char delimiter;
  char **argv_local;
  int argc_local;
  
  if (argc != 1) {
    commandline_args._3_1_ = ' ';
    local_20 = 0;
    kernelInfo.
    super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    while( true ) {
      bVar9 = false;
      if (kernelInfo.
          super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < argc) {
        bVar9 = *argv[kernelInfo.
                      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == '-';
      }
      if (!bVar9) break;
      iVar1 = strcmp(argv[kernelInfo.
                          super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],"--delimiter");
      if (iVar1 == 0) {
        kernelInfo.
        super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             kernelInfo.
             super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        commandline_args._3_1_ =
             *argv[kernelInfo.
                   super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_];
      }
      iVar1 = strcmp(argv[kernelInfo.
                          super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],"--fixed-width")
      ;
      if (iVar1 == 0) {
        kernelInfo.
        super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             kernelInfo.
             super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        local_20 = atoi(argv[kernelInfo.
                             super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_]);
      }
      kernelInfo.
      super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           kernelInfo.
           super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
    std::
    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
    ::vector((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
              *)&totalKernelsTime);
    totalExecuteTime = 0.0;
    totalKernelsCalls = 0;
    lStack_58 = 0;
    for (the_file._4_4_ =
              kernelInfo.
              super__Vector_base<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; the_file._4_4_ < argc;
        the_file._4_4_ = the_file._4_4_ + 1) {
      local_68 = fopen(argv[the_file._4_4_],"rb");
      new_kernel = (KernelPerformanceInfo *)0x0;
      fread(&new_kernel,8,1,local_68);
      totalKernelsCalls = (uint64_t)((double)new_kernel + (double)totalKernelsCalls);
      while (iVar1 = feof(local_68), iVar1 == 0) {
        pKVar3 = (KernelPerformanceInfo *)operator_new(0x48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&kernelIndex,"",&local_a9);
        KokkosTools::KernelTimer::KernelPerformanceInfo::KernelPerformanceInfo
                  (pKVar3,(string *)&kernelIndex,PARALLEL_FOR);
        std::__cxx11::string::~string((string *)&kernelIndex);
        std::allocator<char>::~allocator(&local_a9);
        local_88 = pKVar3;
        bVar9 = KokkosTools::KernelTimer::KernelPerformanceInfo::readFromFile
                          (pKVar3,(FILE *)local_68);
        if (bVar9) {
          KokkosTools::KernelTimer::KernelPerformanceInfo::getName_abi_cxx11_(local_88);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            kernelName = KokkosTools::KernelTimer::KernelPerformanceInfo::getName_abi_cxx11_
                                   (local_88);
            iVar1 = KokkosTools::KernelTimer::find_index
                              ((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                *)&totalKernelsTime,kernelName);
            if (iVar1 < 0) {
              std::
              vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
              ::push_back((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                           *)&totalKernelsTime,&local_88);
            }
            else {
              ppKVar5 = std::
                        vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                      *)&totalKernelsTime,(long)iVar1);
              pKVar3 = *ppKVar5;
              dVar10 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(local_88);
              KokkosTools::KernelTimer::KernelPerformanceInfo::addTime(pKVar3,dVar10);
              ppKVar5 = std::
                        vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                      *)&totalKernelsTime,(long)iVar1);
              pKVar3 = *ppKVar5;
              uVar6 = KokkosTools::KernelTimer::KernelPerformanceInfo::getCallCount(local_88);
              KokkosTools::KernelTimer::KernelPerformanceInfo::addCallCount(pKVar3,uVar6);
            }
          }
        }
      }
      fclose(local_68);
    }
    __first = std::
              vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
              ::begin((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                       *)&totalKernelsTime);
    __last = std::
             vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
             ::end((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    *)&totalKernelsTime);
    std::
    sort<__gnu_cxx::__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo**,std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo*,std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo*>>>,bool(*)(KokkosTools::KernelTimer::KernelPerformanceInfo*,KokkosTools::KernelTimer::KernelPerformanceInfo*)>
              ((__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )__first._M_current,
               (__normal_iterator<KokkosTools::KernelTimer::KernelPerformanceInfo_**,_std::vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                )__last._M_current,KokkosTools::KernelTimer::compareKernelPerformanceInfo);
    for (callCountDouble._4_4_ = 0;
        sVar7 = std::
                vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ::size((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        *)&totalKernelsTime), callCountDouble._4_4_ < sVar7;
        callCountDouble._4_4_ = callCountDouble._4_4_ + 1) {
      ppKVar5 = std::
                vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                              *)&totalKernelsTime,(ulong)callCountDouble._4_4_);
      KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
      if (KVar2 != REGION) {
        ppKVar5 = std::
                  vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                  ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                *)&totalKernelsTime,(ulong)callCountDouble._4_4_);
        dVar10 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
        totalExecuteTime = totalExecuteTime + dVar10;
        ppKVar5 = std::
                  vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                  ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                *)&totalKernelsTime,(ulong)callCountDouble._4_4_);
        uVar6 = KokkosTools::KernelTimer::KernelPerformanceInfo::getCallCount(*ppKVar5);
        lStack_58 = uVar6 + lStack_58;
      }
    }
    printf(
          " (Type)   Total Time, Call Count, Avg. Time per Call, %%Total Time in Kernels, %%Total Program Time\n"
          );
    printf("-------------------------------------------------------------------------\n\n");
    printf("Regions: \n\n");
    for (callCountDouble._0_4_ = 0;
        sVar7 = std::
                vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ::size((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        *)&totalKernelsTime), callCountDouble._0_4_ < sVar7;
        callCountDouble._0_4_ = callCountDouble._0_4_ + 1) {
      ppKVar5 = std::
                vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                              *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
      uVar6 = KokkosTools::KernelTimer::KernelPerformanceInfo::getCallCount(*ppKVar5);
      auVar15._8_4_ = (int)(uVar6 >> 0x20);
      auVar15._0_8_ = uVar6;
      auVar15._12_4_ = 0x45300000;
      dVar10 = (auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
      ppKVar5 = std::
                vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                              *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
      KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
      if (KVar2 == REGION) {
        if (local_20 == 0) {
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          KokkosTools::KernelTimer::KernelPerformanceInfo::getName_abi_cxx11_(*ppKVar5);
          uVar8 = std::__cxx11::string::c_str();
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
          if (KVar2 == PARALLEL_FOR) {
            local_248 = " (ParFor)  ";
          }
          else {
            ppKVar5 = std::
                      vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                      ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                    *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
            KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
            if (KVar2 == PARALLEL_REDUCE) {
              local_258 = " (ParRed)  ";
            }
            else {
              ppKVar5 = std::
                        vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                      *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
              KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
              if (KVar2 == PARALLEL_SCAN) {
                local_268 = " (ParScan) ";
              }
              else {
                local_268 = " (REGION)  ";
              }
              local_258 = local_268;
            }
            local_248 = local_258;
          }
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          dVar11 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          uVar6 = KokkosTools::KernelTimer::KernelPerformanceInfo::getCallCount(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          dVar12 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          dVar13 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          dVar13 = dVar13 / totalExecuteTime;
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          dVar14 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          printf("- %s\n%s%c%f%c%lu%c%f%c%f%c%f\n",dVar11,dVar12 / dVar10,dVar13 * 100.0,
                 (dVar14 / (double)totalKernelsCalls) * 100.0,uVar8,local_248,
                 (ulong)(uint)(int)commandline_args._3_1_,(ulong)(uint)(int)commandline_args._3_1_,
                 uVar6,(int)commandline_args._3_1_,(int)commandline_args._3_1_,
                 (int)commandline_args._3_1_);
        }
        else {
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          KokkosTools::KernelTimer::KernelPerformanceInfo::getName_abi_cxx11_(*ppKVar5);
          uVar8 = std::__cxx11::string::c_str();
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
          if (KVar2 == PARALLEL_FOR) {
            local_1a0 = " (ParFor)  ";
          }
          else {
            ppKVar5 = std::
                      vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                      ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                    *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
            KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
            if (KVar2 == PARALLEL_REDUCE) {
              local_1b0 = " (ParRed)  ";
            }
            else {
              ppKVar5 = std::
                        vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                      *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
              KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
              if (KVar2 == PARALLEL_SCAN) {
                local_1c0 = " (ParScan) ";
              }
              else {
                local_1c0 = " (Region)  ";
              }
              local_1b0 = local_1c0;
            }
            local_1a0 = local_1b0;
          }
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          dVar11 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          uVar6 = KokkosTools::KernelTimer::KernelPerformanceInfo::getCallCount(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          dVar12 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          dVar13 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          dVar13 = dVar13 / totalExecuteTime;
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble._0_4_);
          dVar14 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          printf("- %100s\n%11s%c%15.5f%c%12lu%c%15.5f%c%7.3f%c%7.3f\n",dVar11,dVar12 / dVar10,
                 dVar13 * 100.0,(dVar14 / (double)totalKernelsCalls) * 100.0,uVar8,local_1a0,
                 (ulong)(uint)(int)commandline_args._3_1_,(ulong)(uint)(int)commandline_args._3_1_,
                 uVar6,(int)commandline_args._3_1_,(int)commandline_args._3_1_,
                 (int)commandline_args._3_1_);
        }
      }
    }
    printf("\n");
    printf("-------------------------------------------------------------------------\n");
    printf("Kernels: \n\n");
    for (callCountDouble_1._4_4_ = 0;
        sVar7 = std::
                vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ::size((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        *)&totalKernelsTime), callCountDouble_1._4_4_ < sVar7;
        callCountDouble_1._4_4_ = callCountDouble_1._4_4_ + 1) {
      ppKVar5 = std::
                vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                              *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
      uVar6 = KokkosTools::KernelTimer::KernelPerformanceInfo::getCallCount(*ppKVar5);
      auVar16._8_4_ = (int)(uVar6 >> 0x20);
      auVar16._0_8_ = uVar6;
      auVar16._12_4_ = 0x45300000;
      dVar10 = (auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
      ppKVar5 = std::
                vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                              *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
      KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
      if (KVar2 != REGION) {
        if (local_20 == 0) {
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          KokkosTools::KernelTimer::KernelPerformanceInfo::getName_abi_cxx11_(*ppKVar5);
          uVar8 = std::__cxx11::string::c_str();
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
          if (KVar2 == PARALLEL_FOR) {
            local_3b0 = " (ParFor)  ";
          }
          else {
            ppKVar5 = std::
                      vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                      ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                    *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
            KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
            if (KVar2 == PARALLEL_REDUCE) {
              local_3c0 = " (ParRed)  ";
            }
            else {
              ppKVar5 = std::
                        vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                      *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
              KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
              if (KVar2 == PARALLEL_SCAN) {
                local_3d0 = " (ParScan) ";
              }
              else {
                local_3d0 = " (REGION)  ";
              }
              local_3c0 = local_3d0;
            }
            local_3b0 = local_3c0;
          }
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          dVar11 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          uVar6 = KokkosTools::KernelTimer::KernelPerformanceInfo::getCallCount(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          dVar12 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          dVar13 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          dVar13 = dVar13 / totalExecuteTime;
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          dVar14 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          printf("- %s\n%s%c%f%c%lu%c%f%c%f%c%f\n",dVar11,dVar12 / dVar10,dVar13 * 100.0,
                 (dVar14 / (double)totalKernelsCalls) * 100.0,uVar8,local_3b0,
                 (ulong)(uint)(int)commandline_args._3_1_,(ulong)(uint)(int)commandline_args._3_1_,
                 uVar6,(int)commandline_args._3_1_,(int)commandline_args._3_1_,
                 (int)commandline_args._3_1_);
        }
        else {
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          KokkosTools::KernelTimer::KernelPerformanceInfo::getName_abi_cxx11_(*ppKVar5);
          uVar8 = std::__cxx11::string::c_str();
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
          if (KVar2 == PARALLEL_FOR) {
            local_308 = " (ParFor)  ";
          }
          else {
            ppKVar5 = std::
                      vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                      ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                    *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
            KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
            if (KVar2 == PARALLEL_REDUCE) {
              local_318 = " (ParRed)  ";
            }
            else {
              ppKVar5 = std::
                        vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                        ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                      *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
              KVar2 = KokkosTools::KernelTimer::KernelPerformanceInfo::getKernelType(*ppKVar5);
              if (KVar2 == PARALLEL_SCAN) {
                local_328 = " (ParScan) ";
              }
              else {
                local_328 = " (Region)  ";
              }
              local_318 = local_328;
            }
            local_308 = local_318;
          }
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          dVar11 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          uVar6 = KokkosTools::KernelTimer::KernelPerformanceInfo::getCallCount(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          dVar12 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          dVar13 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          dVar13 = dVar13 / totalExecuteTime;
          ppKVar5 = std::
                    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                    ::operator[]((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
                                  *)&totalKernelsTime,(ulong)callCountDouble_1._4_4_);
          dVar14 = KokkosTools::KernelTimer::KernelPerformanceInfo::getTime(*ppKVar5);
          printf("- %100s\n%11s%c%15.5f%c%12lu%c%15.5f%c%7.3f%c%7.3f\n",dVar11,dVar12 / dVar10,
                 dVar13 * 100.0,(dVar14 / (double)totalKernelsCalls) * 100.0,uVar8,local_308,
                 (ulong)(uint)(int)commandline_args._3_1_,(ulong)(uint)(int)commandline_args._3_1_,
                 uVar6,(int)commandline_args._3_1_,(int)commandline_args._3_1_,
                 (int)commandline_args._3_1_);
        }
      }
    }
    printf("\n");
    printf("-------------------------------------------------------------------------\n");
    printf("Summary:\n");
    printf("\n");
    printf("Total Execution Time (incl. Kokkos + non-Kokkos):      %20.5f seconds\n",
           totalKernelsCalls);
    printf("Total Time in Kokkos kernels:                          %20.5f seconds\n",
           totalExecuteTime);
    printf("   -> Time outside Kokkos kernels:                     %20.5f seconds\n",
           (double)totalKernelsCalls - totalExecuteTime);
    printf("   -> Percentage in Kokkos kernels:                    %20.2f %%\n",
           (totalExecuteTime / (double)totalKernelsCalls) * 100.0);
    printf("Total Calls to Kokkos Kernels:                         %20lu\n",lStack_58);
    printf("\n");
    printf("-------------------------------------------------------------------------\n");
    std::
    vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
    ::~vector((vector<KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::allocator<KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>
               *)&totalKernelsTime);
    return 0;
  }
  fprintf(_stderr,"Did you specify any data files on the command line!\n");
  fprintf(_stderr,"Usage: ./reader file1.dat [fileX.dat]*\n");
  exit(-1);
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc == 1) {
    fprintf(stderr, "Did you specify any data files on the command line!\n");
    fprintf(stderr, "Usage: ./reader file1.dat [fileX.dat]*\n");
    exit(-1);
  }

  char delimiter  = ' ';
  int fixed_width = 0;

  int commandline_args = 1;
  while ((commandline_args < argc) && (argv[commandline_args][0] == '-')) {
    if (strcmp(argv[commandline_args], "--delimiter") == 0) {
      delimiter = argv[++commandline_args][0];
    }
    if (strcmp(argv[commandline_args], "--fixed-width") == 0) {
      fixed_width = atoi(argv[++commandline_args]);
    }

    commandline_args++;
  }

  std::vector<KernelPerformanceInfo*> kernelInfo;
  double totalKernelsTime    = 0;
  double totalExecuteTime    = 0;
  uint64_t totalKernelsCalls = 0;

  for (int i = commandline_args; i < argc; i++) {
    FILE* the_file = fopen(argv[i], "rb");

    double fileExecuteTime = 0;
    fread(&fileExecuteTime, sizeof(fileExecuteTime), 1, the_file);

    totalExecuteTime += fileExecuteTime;

    while (!feof(the_file)) {
      KernelPerformanceInfo* new_kernel =
          new KernelPerformanceInfo("", PARALLEL_FOR);
      if (new_kernel->readFromFile(the_file)) {
        if (!new_kernel->getName().empty()) {
          int kernelIndex = find_index(kernelInfo, new_kernel->getName());

          if (kernelIndex > -1) {
            kernelInfo[kernelIndex]->addTime(new_kernel->getTime());
            kernelInfo[kernelIndex]->addCallCount(new_kernel->getCallCount());
          } else {
            kernelInfo.push_back(new_kernel);
          }
        }
      }
    }

    fclose(the_file);
  }

  std::sort(kernelInfo.begin(), kernelInfo.end(), compareKernelPerformanceInfo);

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    if (kernelInfo[i]->getKernelType() != REGION) {
      totalKernelsTime += kernelInfo[i]->getTime();
      totalKernelsCalls += kernelInfo[i]->getCallCount();
    }
  }

  printf(
      " (Type)   Total Time, Call Count, Avg. Time per Call, %%Total Time in "
      "Kernels, %%Total Program Time\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n\n");

  printf("Regions: \n\n");

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    const double callCountDouble = (double)kernelInfo[i]->getCallCount();

    if (kernelInfo[i]->getKernelType() != REGION) continue;
    if (fixed_width)
      printf("- %100s\n%11s%c%15.5f%c%12" PRIu64 "%c%15.5f%c%7.3f%c%7.3f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (Region)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
    else
      printf("- %s\n%s%c%f%c%" PRIu64 "%c%f%c%f%c%f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (REGION)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
  }

  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");
  printf("Kernels: \n\n");

  for (unsigned int i = 0; i < kernelInfo.size(); i++) {
    const double callCountDouble = (double)kernelInfo[i]->getCallCount();

    if (kernelInfo[i]->getKernelType() == REGION) continue;
    if (fixed_width)
      printf("- %100s\n%11s%c%15.5f%c%12" PRIu64 "%c%15.5f%c%7.3f%c%7.3f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (Region)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
    else
      printf("- %s\n%s%c%f%c%" PRIu64 "%c%f%c%f%c%f\n",
             kernelInfo[i]->getName().c_str(),
             (kernelInfo[i]->getKernelType() == PARALLEL_FOR)
                 ? (" (ParFor)  ")
                 : ((kernelInfo[i]->getKernelType() == PARALLEL_REDUCE)
                        ? (" (ParRed)  ")
                        : ((kernelInfo[i]->getKernelType() == PARALLEL_SCAN)
                               ? (" (ParScan) ")
                               : (" (REGION)  "))),
             delimiter, kernelInfo[i]->getTime(), delimiter,
             kernelInfo[i]->getCallCount(), delimiter,
             kernelInfo[i]->getTime() / callCountDouble, delimiter,
             (kernelInfo[i]->getTime() / totalKernelsTime) * 100.0, delimiter,
             (kernelInfo[i]->getTime() / totalExecuteTime) * 100.0);
  }

  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");
  printf("Summary:\n");
  printf("\n");
  printf(
      "Total Execution Time (incl. Kokkos + non-Kokkos):      %20.5f seconds\n",
      totalExecuteTime);
  printf(
      "Total Time in Kokkos kernels:                          %20.5f seconds\n",
      totalKernelsTime);
  printf(
      "   -> Time outside Kokkos kernels:                     %20.5f seconds\n",
      (totalExecuteTime - totalKernelsTime));
  printf("   -> Percentage in Kokkos kernels:                    %20.2f %%\n",
         (totalKernelsTime / totalExecuteTime) * 100);
  printf("Total Calls to Kokkos Kernels:                         %20" PRIu64
         "\n",
         totalKernelsCalls);
  printf("\n");
  printf(
      "------------------------------------------------------------------------"
      "-\n");

  return 0;
}